

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O2

bool embree::sse2::SphereMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  int iVar29;
  uint uVar30;
  RTCIntersectArguments *pRVar31;
  RTCFilterFunctionN p_Var32;
  RTCRayN *pRVar33;
  long lVar34;
  ulong uVar35;
  bool bVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  float fVar59;
  float fVar61;
  float fVar63;
  undefined1 auVar52 [16];
  uint uVar51;
  uint uVar60;
  uint uVar62;
  uint uVar64;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar70 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 in_XMM14 [16];
  undefined1 auVar88 [16];
  Scene *scene;
  undefined1 local_208 [16];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  uint local_d8 [4];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar13 = context->scene;
  uVar30 = sphere->sharedGeomID;
  uVar39 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar14 = (pSVar13->geometries).items[uVar30].ptr;
  fVar50 = pGVar14->fnumTimeSegments;
  fVar41 = (pGVar14->time_range).lower;
  fVar40 = ((*(float *)(ray + k * 4 + 0x70) - fVar41) / ((pGVar14->time_range).upper - fVar41)) *
           fVar50;
  fVar41 = floorf(fVar40);
  fVar50 = fVar50 + -1.0;
  if (fVar50 <= fVar41) {
    fVar41 = fVar50;
  }
  fVar50 = 0.0;
  if (0.0 <= fVar41) {
    fVar50 = fVar41;
  }
  fVar40 = fVar40 - fVar50;
  lVar15 = *(long *)&pGVar14[2].numPrimitives;
  lVar34 = (long)(int)fVar50 * 0x38;
  lVar16 = *(long *)(lVar15 + lVar34);
  lVar17 = *(long *)(lVar15 + 0x10 + lVar34);
  pfVar1 = (float *)(lVar16 + lVar17 * uVar39);
  uVar35 = (ulong)(sphere->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar16 + lVar17 * uVar35);
  uVar37 = (ulong)(sphere->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar16 + lVar17 * uVar37);
  uVar38 = (ulong)(sphere->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar16 + lVar17 * uVar38);
  lVar16 = *(long *)(lVar15 + 0x38 + lVar34);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar34);
  pfVar5 = (float *)(lVar16 + uVar39 * lVar15);
  pfVar6 = (float *)(lVar16 + uVar35 * lVar15);
  pfVar7 = (float *)(lVar16 + uVar37 * lVar15);
  pfVar8 = (float *)(lVar16 + lVar15 * uVar38);
  fVar42 = 1.0 - fVar40;
  fVar43 = fVar42 * pfVar1[3] + fVar40 * pfVar5[3];
  fVar47 = fVar42 * pfVar2[3] + fVar40 * pfVar6[3];
  fVar48 = fVar42 * pfVar3[3] + fVar40 * pfVar7[3];
  fVar49 = fVar42 * pfVar4[3] + fVar40 * pfVar8[3];
  uVar51 = (uint)sphere->numPrimitives;
  local_d8[0] = uVar30;
  local_d8[1] = uVar30;
  local_d8[2] = uVar30;
  local_d8[3] = uVar30;
  fVar50 = *(float *)(ray + k * 4);
  fVar41 = *(float *)(ray + k * 4 + 0x10);
  fVar83 = *(float *)(ray + k * 4 + 0x20);
  fVar77 = (*pfVar1 * fVar42 + *pfVar5 * fVar40) - fVar50;
  fVar78 = (*pfVar2 * fVar42 + *pfVar6 * fVar40) - fVar50;
  fVar79 = (*pfVar3 * fVar42 + *pfVar7 * fVar40) - fVar50;
  fVar50 = (*pfVar4 * fVar42 + *pfVar8 * fVar40) - fVar50;
  fVar74 = (pfVar1[1] * fVar42 + pfVar5[1] * fVar40) - fVar41;
  fVar75 = (pfVar2[1] * fVar42 + pfVar6[1] * fVar40) - fVar41;
  fVar76 = (pfVar3[1] * fVar42 + pfVar7[1] * fVar40) - fVar41;
  fVar41 = (pfVar4[1] * fVar42 + pfVar8[1] * fVar40) - fVar41;
  fVar80 = (pfVar1[2] * fVar42 + pfVar5[2] * fVar40) - fVar83;
  fVar81 = (pfVar2[2] * fVar42 + pfVar6[2] * fVar40) - fVar83;
  fVar82 = (pfVar3[2] * fVar42 + pfVar7[2] * fVar40) - fVar83;
  fVar83 = (pfVar4[2] * fVar42 + pfVar8[2] * fVar40) - fVar83;
  fVar40 = *(float *)(ray + k * 4 + 0x40);
  fVar42 = *(float *)(ray + k * 4 + 0x50);
  fVar9 = *(float *)(ray + k * 4 + 0x60);
  fVar67 = fVar42 * fVar42 + fVar9 * fVar9;
  auVar88._0_4_ = fVar40 * fVar40 + fVar67;
  auVar88._4_4_ = auVar88._0_4_;
  auVar88._8_4_ = auVar88._0_4_;
  auVar88._12_4_ = auVar88._0_4_;
  auVar69 = rcpps(ZEXT416((uint)fVar67),auVar88);
  fVar67 = auVar69._0_4_;
  fVar59 = auVar69._4_4_;
  fVar61 = auVar69._8_4_;
  fVar63 = auVar69._12_4_;
  fVar67 = (1.0 - auVar88._0_4_ * fVar67) * fVar67 + fVar67;
  fVar59 = (1.0 - auVar88._0_4_ * fVar59) * fVar59 + fVar59;
  fVar61 = (1.0 - auVar88._0_4_ * fVar61) * fVar61 + fVar61;
  fVar63 = (1.0 - auVar88._0_4_ * fVar63) * fVar63 + fVar63;
  fVar84 = (fVar77 * fVar40 + fVar74 * fVar42 + fVar80 * fVar9) * fVar67;
  fVar85 = (fVar78 * fVar40 + fVar75 * fVar42 + fVar81 * fVar9) * fVar59;
  fVar86 = (fVar79 * fVar40 + fVar76 * fVar42 + fVar82 * fVar9) * fVar61;
  fVar87 = (fVar50 * fVar40 + fVar41 * fVar42 + fVar83 * fVar9) * fVar63;
  fVar77 = fVar77 - fVar40 * fVar84;
  fVar78 = fVar78 - fVar40 * fVar85;
  fVar79 = fVar79 - fVar40 * fVar86;
  fVar50 = fVar50 - fVar40 * fVar87;
  fVar74 = fVar74 - fVar42 * fVar84;
  fVar75 = fVar75 - fVar42 * fVar85;
  fVar76 = fVar76 - fVar42 * fVar86;
  fVar41 = fVar41 - fVar42 * fVar87;
  fVar80 = fVar80 - fVar9 * fVar84;
  fVar81 = fVar81 - fVar9 * fVar85;
  fVar82 = fVar82 - fVar9 * fVar86;
  fVar83 = fVar83 - fVar9 * fVar87;
  fVar68 = fVar77 * fVar77 + fVar74 * fVar74 + fVar80 * fVar80;
  fVar71 = fVar78 * fVar78 + fVar75 * fVar75 + fVar81 * fVar81;
  fVar72 = fVar79 * fVar79 + fVar76 * fVar76 + fVar82 * fVar82;
  fVar73 = fVar50 * fVar50 + fVar41 * fVar41 + fVar83 * fVar83;
  fVar43 = fVar43 * fVar43;
  fVar47 = fVar47 * fVar47;
  fVar48 = fVar48 * fVar48;
  fVar49 = fVar49 * fVar49;
  bVar26 = uVar51 != 0 && fVar68 <= fVar43;
  auVar69._0_4_ = -(uint)bVar26;
  bVar27 = 1 < uVar51 && fVar71 <= fVar47;
  auVar69._4_4_ = -(uint)bVar27;
  bVar25 = 2 < uVar51 && fVar72 <= fVar48;
  auVar69._8_4_ = -(uint)bVar25;
  bVar22 = 3 < uVar51 && fVar73 <= fVar49;
  auVar69._12_4_ = -(uint)bVar22;
  iVar29 = movmskps(uVar51,auVar69);
  if (iVar29 != 0) {
    auVar52._0_4_ = fVar67 * (fVar43 - fVar68);
    auVar52._4_4_ = fVar59 * (fVar47 - fVar71);
    auVar52._8_4_ = fVar61 * (fVar48 - fVar72);
    auVar52._12_4_ = fVar63 * (fVar49 - fVar73);
    auVar88 = sqrtps(in_XMM14,auVar52);
    fVar61 = auVar88._0_4_;
    fVar48 = fVar84 - fVar61;
    fVar63 = auVar88._4_4_;
    fVar49 = fVar85 - fVar63;
    fVar68 = auVar88._8_4_;
    fVar67 = fVar86 - fVar68;
    fVar71 = auVar88._12_4_;
    fVar59 = fVar87 - fVar71;
    fVar84 = fVar84 + fVar61;
    fVar85 = fVar85 + fVar63;
    fVar86 = fVar86 + fVar68;
    fVar87 = fVar87 + fVar71;
    fVar43 = *(float *)(ray + k * 4 + 0x30);
    fVar47 = *(float *)(ray + k * 4 + 0x80);
    bVar23 = fVar48 <= fVar47 && fVar43 <= fVar48;
    bVar24 = fVar49 <= fVar47 && fVar43 <= fVar49;
    bVar21 = fVar67 <= fVar47 && fVar43 <= fVar67;
    bVar20 = fVar59 <= fVar47 && fVar43 <= fVar59;
    uVar51 = -(uint)(bVar23 && bVar26);
    uVar60 = -(uint)(bVar24 && bVar27);
    auVar65._4_4_ = uVar60;
    auVar65._0_4_ = uVar51;
    uVar62 = -(uint)(bVar21 && bVar25);
    uVar64 = -(uint)(bVar20 && bVar22);
    bVar26 = (fVar43 <= fVar84 && fVar84 <= fVar47) && bVar26;
    auVar70._0_4_ = -(uint)bVar26;
    bVar27 = (fVar43 <= fVar85 && fVar85 <= fVar47) && bVar27;
    auVar70._4_4_ = -(uint)bVar27;
    bVar25 = (fVar43 <= fVar86 && fVar86 <= fVar47) && bVar25;
    auVar70._8_4_ = -(uint)bVar25;
    bVar22 = (fVar43 <= fVar87 && fVar87 <= fVar47) && bVar22;
    auVar70._12_4_ = -(uint)bVar22;
    auVar65._8_4_ = uVar62;
    auVar65._12_4_ = uVar64;
    uVar30 = movmskps(iVar29,auVar65 | auVar70);
    if (uVar30 != 0) {
      auVar66._0_4_ = ~uVar51 & (uint)fVar84;
      auVar66._4_4_ = ~uVar60 & (uint)fVar85;
      auVar66._8_4_ = ~uVar62 & (uint)fVar86;
      auVar66._12_4_ = ~uVar64 & (uint)fVar87;
      auVar44._0_4_ = (uint)fVar48 & uVar51;
      auVar44._4_4_ = (uint)fVar49 & uVar60;
      auVar44._8_4_ = (uint)fVar67 & uVar62;
      auVar44._12_4_ = (uint)fVar59 & uVar64;
      fVar43 = (float)(~uVar51 & (uint)fVar61 | (uint)-fVar61 & uVar51);
      fVar48 = (float)(~uVar60 & (uint)fVar63 | (uint)-fVar63 & uVar60);
      fVar49 = (float)(~uVar62 & (uint)fVar68 | (uint)-fVar68 & uVar62);
      fVar67 = (float)(~uVar64 & (uint)fVar71 | (uint)-fVar71 & uVar64);
      hit.vNg.field_0._0_4_ = fVar40 * fVar43 - fVar77;
      hit.vNg.field_0._4_4_ = fVar40 * fVar48 - fVar78;
      hit.vNg.field_0._8_4_ = fVar40 * fVar49 - fVar79;
      hit.vNg.field_0._12_4_ = fVar40 * fVar67 - fVar50;
      hit.vNg.field_0._16_4_ = fVar42 * fVar43 - fVar74;
      hit.vNg.field_0._20_4_ = fVar42 * fVar48 - fVar75;
      hit.vNg.field_0._24_4_ = fVar42 * fVar49 - fVar76;
      hit.vNg.field_0._28_4_ = fVar42 * fVar67 - fVar41;
      hit.vNg.field_0._32_4_ = fVar43 * fVar9 - fVar80;
      hit.vNg.field_0._36_4_ = fVar48 * fVar9 - fVar81;
      hit.vNg.field_0._40_4_ = fVar49 * fVar9 - fVar82;
      hit.vNg.field_0._44_4_ = fVar67 * fVar9 - fVar83;
      hit.vt.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar44 | auVar66);
      uVar39 = (ulong)(uVar30 & 0xff);
      auVar88 = _DAT_01f45a40;
      do {
        args.hit = (RTCHitN *)local_c8;
        uVar35 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        local_68 = local_d8[uVar35];
        pGVar14 = (pSVar13->geometries).items[local_68].ptr;
        pRVar31 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
        args.ray = (RTCRayN *)ray;
        if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          pRVar31 = context->args;
          if ((pRVar31->filter == (RTCFilterFunctionN)0x0) &&
             (bVar36 = true, pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_003405b2;
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar35];
          args.context = context->user;
          local_78 = (sphere->primIDs).field_0.i[uVar35];
          local_c8._4_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + uVar35 * 4);
          local_b8._4_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + uVar35 * 4 + 0x10);
          local_a8._4_4_ = *(undefined4 *)((long)&hit.vNg.field_0 + uVar35 * 4 + 0x20);
          local_c8._0_4_ = local_c8._4_4_;
          local_c8._8_4_ = local_c8._4_4_;
          local_c8._12_4_ = local_c8._4_4_;
          local_b8._0_4_ = local_b8._4_4_;
          local_b8._8_4_ = local_b8._4_4_;
          local_b8._12_4_ = local_b8._4_4_;
          local_a8._0_4_ = local_a8._4_4_;
          local_a8._8_4_ = local_a8._4_4_;
          local_a8._12_4_ = local_a8._4_4_;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          uStack_54 = (args.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_44 = (args.context)->instPrimID[0];
          local_48 = uStack_44;
          uStack_40 = uStack_44;
          uStack_3c = uStack_44;
          local_208 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          args.geometryUserPtr = pGVar14->userPtr;
          args.N = 4;
          p_Var32 = pGVar14->occlusionFilterN;
          args.valid = (int *)local_208;
          if (p_Var32 != (RTCFilterFunctionN)0x0) {
            p_Var32 = (RTCFilterFunctionN)(*p_Var32)(&args);
            auVar88 = _DAT_01f45a40;
          }
          auVar54._8_4_ = 0xffffffff;
          auVar54._0_8_ = 0xffffffffffffffff;
          auVar54._12_4_ = 0xffffffff;
          auVar53._0_4_ = -(uint)(local_208._0_4_ == 0);
          auVar53._4_4_ = -(uint)(local_208._4_4_ == 0);
          auVar53._8_4_ = -(uint)(local_208._8_4_ == 0);
          auVar53._12_4_ = -(uint)(local_208._12_4_ == 0);
          uVar30 = movmskps((int)p_Var32,auVar53);
          pRVar33 = (RTCRayN *)(ulong)(uVar30 ^ 0xf);
          if ((uVar30 ^ 0xf) == 0) {
            auVar54 = auVar53 ^ auVar54;
          }
          else {
            p_Var32 = context->args->filter;
            if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var32)(&args);
              auVar54._8_4_ = 0xffffffff;
              auVar54._0_8_ = 0xffffffffffffffff;
              auVar54._12_4_ = 0xffffffff;
              auVar88 = _DAT_01f45a40;
            }
            auVar45._0_4_ = -(uint)(local_208._0_4_ == 0);
            auVar45._4_4_ = -(uint)(local_208._4_4_ == 0);
            auVar45._8_4_ = -(uint)(local_208._8_4_ == 0);
            auVar45._12_4_ = -(uint)(local_208._12_4_ == 0);
            auVar54 = auVar45 ^ auVar54;
            *(undefined1 (*) [16])(args.ray + 0x80) =
                 ~auVar45 & auVar88 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar45;
            pRVar33 = args.ray;
          }
          auVar55._0_4_ = auVar54._0_4_ << 0x1f;
          auVar55._4_4_ = auVar54._4_4_ << 0x1f;
          auVar55._8_4_ = auVar54._8_4_ << 0x1f;
          auVar55._12_4_ = auVar54._12_4_ << 0x1f;
          uVar30 = movmskps((int)pRVar33,auVar55);
          pRVar31 = (RTCIntersectArguments *)(ulong)uVar30;
          if (uVar30 != 0) {
            fVar47 = *(float *)(ray + k * 4 + 0x80);
            bVar36 = true;
            goto LAB_003405b2;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar47;
        }
        uVar39 = uVar39 ^ 1L << (uVar35 & 0x3f);
      } while (uVar39 != 0);
      bVar36 = false;
LAB_003405b2:
      auVar19._4_4_ = -(uint)((fVar85 <= fVar47 && bVar24) && bVar27);
      auVar19._0_4_ = -(uint)((fVar84 <= fVar47 && bVar23) && bVar26);
      auVar19._8_4_ = -(uint)((fVar86 <= fVar47 && bVar21) && bVar25);
      auVar19._12_4_ = -(uint)((fVar87 <= fVar47 && bVar20) && bVar22);
      uVar30 = movmskps((int)pRVar31,auVar19);
      if (uVar30 == 0) {
        return bVar36;
      }
      hit.vt.field_0.v[1] = fVar85;
      hit.vt.field_0.v[0] = fVar84;
      hit.vt.field_0.v[2] = fVar86;
      hit.vt.field_0.v[3] = fVar87;
      hit.vNg.field_0._4_4_ = fVar40 * fVar63 - fVar78;
      hit.vNg.field_0._0_4_ = fVar40 * fVar61 - fVar77;
      hit.vNg.field_0._8_4_ = fVar40 * fVar68 - fVar79;
      hit.vNg.field_0._12_4_ = fVar40 * fVar71 - fVar50;
      hit.vNg.field_0._20_4_ = fVar42 * fVar63 - fVar75;
      hit.vNg.field_0._16_4_ = fVar42 * fVar61 - fVar74;
      hit.vNg.field_0._24_4_ = fVar42 * fVar68 - fVar76;
      hit.vNg.field_0._28_4_ = fVar42 * fVar71 - fVar41;
      hit.vNg.field_0._36_4_ = fVar9 * fVar63 - fVar81;
      hit.vNg.field_0._32_4_ = fVar9 * fVar61 - fVar80;
      hit.vNg.field_0._40_4_ = fVar9 * fVar68 - fVar82;
      hit.vNg.field_0._44_4_ = fVar9 * fVar71 - fVar83;
      pSVar13 = context->scene;
      uVar39 = (ulong)(uVar30 & 0xff);
      do {
        args.hit = (RTCHitN *)local_c8;
        args.valid = (int *)local_208;
        uVar35 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        local_68 = local_d8[uVar35];
        pGVar14 = (pSVar13->geometries).items[local_68].ptr;
        if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar28 = 1, pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0034088d;
          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar35];
          args.context = context->user;
          local_78 = (sphere->primIDs).field_0.i[uVar35];
          uVar10 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar35 * 4);
          uVar11 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar35 * 4 + 0x10);
          uVar12 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar35 * 4 + 0x20);
          local_c8._4_4_ = uVar10;
          local_c8._0_4_ = uVar10;
          local_c8._8_4_ = uVar10;
          local_c8._12_4_ = uVar10;
          local_b8._4_4_ = uVar11;
          local_b8._0_4_ = uVar11;
          local_b8._8_4_ = uVar11;
          local_b8._12_4_ = uVar11;
          local_a8._4_4_ = uVar12;
          local_a8._0_4_ = uVar12;
          local_a8._8_4_ = uVar12;
          local_a8._12_4_ = uVar12;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          uStack_54 = (args.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_44 = (args.context)->instPrimID[0];
          local_48 = uStack_44;
          uStack_40 = uStack_44;
          uStack_3c = uStack_44;
          local_208 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          args.geometryUserPtr = pGVar14->userPtr;
          args.N = 4;
          p_Var32 = pGVar14->occlusionFilterN;
          args.ray = (RTCRayN *)ray;
          if (p_Var32 != (RTCFilterFunctionN)0x0) {
            p_Var32 = (RTCFilterFunctionN)(*p_Var32)(&args);
            auVar88 = _DAT_01f45a40;
          }
          auVar56._0_4_ = -(uint)(local_208._0_4_ == 0);
          auVar56._4_4_ = -(uint)(local_208._4_4_ == 0);
          auVar56._8_4_ = -(uint)(local_208._8_4_ == 0);
          auVar56._12_4_ = -(uint)(local_208._12_4_ == 0);
          uVar30 = movmskps((int)p_Var32,auVar56);
          pRVar33 = (RTCRayN *)(ulong)(uVar30 ^ 0xf);
          if ((uVar30 ^ 0xf) == 0) {
            auVar18._8_4_ = 0xffffffff;
            auVar18._0_8_ = 0xffffffffffffffff;
            auVar18._12_4_ = 0xffffffff;
            auVar57 = auVar56 ^ auVar18;
          }
          else {
            p_Var32 = context->args->filter;
            if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var32)(&args);
              auVar88 = _DAT_01f45a40;
            }
            auVar46._0_4_ = -(uint)(local_208._0_4_ == 0);
            auVar46._4_4_ = -(uint)(local_208._4_4_ == 0);
            auVar46._8_4_ = -(uint)(local_208._8_4_ == 0);
            auVar46._12_4_ = -(uint)(local_208._12_4_ == 0);
            auVar57._8_4_ = 0xffffffff;
            auVar57._0_8_ = 0xffffffffffffffff;
            auVar57._12_4_ = 0xffffffff;
            auVar57 = auVar46 ^ auVar57;
            *(undefined1 (*) [16])(args.ray + 0x80) =
                 ~auVar46 & auVar88 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar46;
            pRVar33 = args.ray;
          }
          auVar58._0_4_ = auVar57._0_4_ << 0x1f;
          auVar58._4_4_ = auVar57._4_4_ << 0x1f;
          auVar58._8_4_ = auVar57._8_4_ << 0x1f;
          auVar58._12_4_ = auVar57._12_4_ << 0x1f;
          iVar29 = movmskps((int)pRVar33,auVar58);
          if (iVar29 != 0) {
            bVar28 = 1;
            goto LAB_0034088d;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar47;
        }
        uVar39 = uVar39 ^ 1L << (uVar35 & 0x3f);
        if (uVar39 == 0) {
          bVar28 = 0;
LAB_0034088d:
          return (bool)(bVar36 | bVar28);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }